

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_parse_address(char *fqma,char **address,hostname *host)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  char *local_50;
  char *dup;
  size_t length;
  CURLcode result;
  hostname *host_local;
  char **address_local;
  char *fqma_local;
  
  local_50 = fqma;
  if (*fqma == '<') {
    local_50 = fqma + 1;
  }
  __s = (*Curl_cstrdup)(local_50);
  if (__s == (char *)0x0) {
    fqma_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar1 = strlen(__s);
    if ((sVar1 != 0) && (__s[sVar1 - 1] == '>')) {
      __s[sVar1 - 1] = '\0';
    }
    pcVar2 = strpbrk(__s,"@");
    host->name = pcVar2;
    if (host->name != (char *)0x0) {
      *host->name = '\0';
      host->name = host->name + 1;
      Curl_idnconvert_hostname(host);
    }
    *address = __s;
    fqma_local._4_4_ = CURLE_OK;
  }
  return fqma_local._4_4_;
}

Assistant:

static CURLcode smtp_parse_address(const char *fqma, char **address,
                                   struct hostname *host)
{
  CURLcode result = CURLE_OK;
  size_t length;

  /* Duplicate the fully qualified email address so we can manipulate it,
     ensuring it does not contain the delimiters if specified */
  char *dup = strdup(fqma[0] == '<' ? fqma + 1  : fqma);
  if(!dup)
    return CURLE_OUT_OF_MEMORY;

  length = strlen(dup);
  if(length) {
    if(dup[length - 1] == '>')
      dup[length - 1] = '\0';
  }

  /* Extract the hostname from the address (if we can) */
  host->name = strpbrk(dup, "@");
  if(host->name) {
    *host->name = '\0';
    host->name = host->name + 1;

    /* Attempt to convert the hostname to IDN ACE */
    (void) Curl_idnconvert_hostname(host);

    /* If Curl_idnconvert_hostname() fails then we shall attempt to continue
       and send the hostname using UTF-8 rather than as 7-bit ACE (which is
       our preference) */
  }

  /* Extract the local address from the mailbox */
  *address = dup;

  return result;
}